

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcWindow::IfcWindow(IfcWindow *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcWindow";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00820258);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x820128;
  *(undefined8 *)&this->field_0x178 = 0x820240;
  *(undefined8 *)&this->field_0x88 = 0x820150;
  *(undefined8 *)&this->field_0x98 = 0x820178;
  *(undefined8 *)&this->field_0xd0 = 0x8201a0;
  *(undefined8 *)&this->field_0x100 = 0x8201c8;
  *(undefined8 *)&this->field_0x138 = 0x8201f0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x820218;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x18 = 0;
  this->field_0x170 = 0;
  return;
}

Assistant:

IfcWindow() : Object("IfcWindow") {}